

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

bool __thiscall
cmTarget::IsLinkInterfaceDependentNumberMinProperty(cmTarget *this,string *p,string *config)

{
  CompatibleInterfaces *pCVar1;
  size_type sVar2;
  bool bVar3;
  
  bVar3 = false;
  if ((this->TargetTypeValue != OBJECT_LIBRARY) &&
     (bVar3 = false, this->TargetTypeValue != INTERFACE_LIBRARY)) {
    pCVar1 = GetCompatibleInterfaces(this,config);
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&pCVar1->PropsNumberMin,p);
    bVar3 = sVar2 != 0;
  }
  return bVar3;
}

Assistant:

bool cmTarget::IsLinkInterfaceDependentNumberMinProperty(const std::string &p,
                                    const std::string& config) const
{
  if (this->TargetTypeValue == OBJECT_LIBRARY
      || this->TargetTypeValue == INTERFACE_LIBRARY)
    {
    return false;
    }
  return this->GetCompatibleInterfaces(config).PropsNumberMin.count(p) > 0;
}